

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O2

void __thiscall
raptor::Thread::Thread
          (Thread *this,char *thread_name,ThreadExecutor *thread_proc,void *arg,bool *success,
          Options *options)

{
  InternalThreadImpl *this_00;
  bool ret;
  bool *local_58;
  function<void_(void_*)> local_50;
  
  ret = false;
  local_58 = success;
  this_00 = (InternalThreadImpl *)operator_new(0x70);
  std::function<void_(void_*)>::function(&local_50,thread_proc);
  InternalThreadImpl::InternalThreadImpl(this_00,thread_name,&local_50,arg,&ret,options);
  this->_impl = (IThreadService *)this_00;
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  if (ret == false) {
    this->_state = kFailed;
    if (this->_impl != (IThreadService *)0x0) {
      (*this->_impl->_vptr_IThreadService[1])();
    }
    this->_impl = (IThreadService *)0x0;
  }
  else {
    this->_state = kAlive;
  }
  if (local_58 != (bool *)0x0) {
    *local_58 = ret;
  }
  return;
}

Assistant:

Thread::Thread(
    const char* thread_name,
    ThreadExecutor thread_proc, void* arg,
    bool* success, const Options& options) {
    bool ret = false;
    _impl = new InternalThreadImpl(thread_name, thread_proc, arg, &ret, options);
    if (!ret) {
        _state = kFailed;
        delete _impl;
        _impl = nullptr;
    } else {
        _state = kAlive;
    }
    if (success) {
        *success = ret;
    }
}